

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O0

void __thiscall
t_swift_generator::generate_swift_struct_implementation
          (t_swift_generator *this,ostream *out,t_struct *tstruct,bool is_result,bool is_private)

{
  ostream *poVar1;
  bool is_private_local;
  bool is_result_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_swift_generator *this_local;
  
  generate_swift_struct_equatable_extension(this,out,tstruct,is_private);
  if (((!is_private) && (!is_result)) && ((this->gen_cocoa_ & 1U) == 0)) {
    generate_swift_struct_printable_extension(this,out,tstruct);
  }
  generate_swift_struct_hashable_extension(this,out,tstruct,is_private);
  generate_swift_struct_thrift_extension(this,out,tstruct,is_result,is_private);
  poVar1 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_swift_generator::generate_swift_struct_implementation(ostream& out,
                                                             t_struct* tstruct,
                                                             bool is_result,
                                                             bool is_private) {

  generate_swift_struct_equatable_extension(out, tstruct, is_private);

  if (!is_private && !is_result && !gen_cocoa_) {  // old compiler didn't use debug_descriptions, OR it with gen_cocoa_ so the flag doesn't matter w/ cocoa
    generate_swift_struct_printable_extension(out, tstruct);
  }

  generate_swift_struct_hashable_extension(out, tstruct, is_private);
  generate_swift_struct_thrift_extension(out, tstruct, is_result, is_private);

  out << endl << endl;
}